

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O2

bool __thiscall jrtplib::RTPIPv4Address::IsSameAddress(RTPIPv4Address *this,RTPAddress *addr)

{
  bool bVar1;
  
  if ((((addr == (RTPAddress *)0x0) || (addr->addresstype != IPv4Address)) ||
      (*(int *)&addr->field_0xc != *(int *)&(this->super_RTPAddress).field_0xc)) ||
     (bVar1 = true, *(uint16_t *)&addr[1]._vptr_RTPAddress != this->port)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RTPIPv4Address::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != IPv4Address)
		return false;

	const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
	if (addr2->GetIP() == ip && addr2->GetPort() == port)
		return true;
	return false;
}